

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall FormatterTest_ZeroFlag_Test::TestBody(FormatterTest_ZeroFlag_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char *pcVar3;
  basic_string_view<char> format_str;
  basic_string_view<char> format_str_00;
  basic_string_view<char> format_str_01;
  basic_string_view<char> format_str_02;
  basic_string_view<char> format_str_03;
  basic_string_view<char> format_str_04;
  basic_string_view<char> format_str_05;
  basic_string_view<char> format_str_06;
  basic_string_view<char> format_str_07;
  basic_string_view<char> format_str_08;
  basic_string_view<char> format_str_09;
  basic_string_view<char> format_str_10;
  basic_string_view<char> format_str_11;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_00;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_01;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_02;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_03;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_04;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_05;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_06;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_07;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_08;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_09;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_10;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args_11;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_12;
  undefined1 local_348 [32];
  char *local_328;
  _Alloc_hider local_320;
  AssertionResult local_318;
  AssertionResult local_300;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  undefined1 *local_2e8;
  long local_2e0;
  undefined8 local_2d8;
  undefined1 local_2d0 [504];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined8 local_58 [2];
  undefined8 local_48 [3];
  
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str.size_ = 5;
  format_str.data_ = "{0:0}";
  args.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args.types_ = fmt::v5::
                format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
                ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str,args,(locale_ref)0x0);
  pAVar1 = (AssertHelperData *)(local_348 + 0x10);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&local_328,"\"42\"","format(\"{0:0}\", 42)",(char (*) [3])0x242e5f,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x42f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffff;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str_00.size_ = 6;
  format_str_00.data_ = "{0:05}";
  args_00.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_00.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,int>
       ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str_00,args_00,(locale_ref)0x0);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_328,"\"-0042\"","format(\"{0:05}\", -42)",(char (*) [6])"-0042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x430,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str_01.size_ = 6;
  format_str_01.data_ = "{0:05}";
  args_01.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_01.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_int>
       ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str_01,args_01,(locale_ref)0x0);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_328,"\"00042\"","format(\"{0:05}\", 42u)",(char (*) [6])"00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x431,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffffffffffff;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str_02.size_ = 6;
  format_str_02.data_ = "{0:05}";
  args_02.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_02.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long>
       ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str_02,args_02,(locale_ref)0x0);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_328,"\"-0042\"","format(\"{0:05}\", -42l)",(char (*) [6])"-0042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x432,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str_03.size_ = 6;
  format_str_03.data_ = "{0:05}";
  args_03.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_03.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long>
       ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str_03,args_03,(locale_ref)0x0);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_328,"\"00042\"","format(\"{0:05}\", 42ul)",(char (*) [6])"00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x433,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0xffffffffffffff;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str_04.size_ = 6;
  format_str_04.data_ = "{0:05}";
  args_04.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_04.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_long>
       ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str_04,args_04,(locale_ref)0x0);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_328,"\"-0042\"","format(\"{0:05}\", -42ll)",(char (*) [6])"-0042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x434,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = true;
  local_318._1_7_ = 0;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str_05.size_ = 6;
  format_str_05.data_ = "{0:05}";
  args_05.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_05.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,unsigned_long_long>
       ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str_05,args_05,(locale_ref)0x0);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_328,"\"00042\"","format(\"{0:05}\", 42ull)",(char (*) [6])"00042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x435,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = false;
  local_318._1_7_ = 0xc0450000000000;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str_06.size_ = 6;
  format_str_06.data_ = "{0:05}";
  args_06.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_06.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,double>
       ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str_06,args_06,(locale_ref)0x0);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_328,"\"-0042\"","format(\"{0:05}\", -42.0)",(char (*) [6])"-0042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x436,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_318.success_ = false;
  local_318._1_7_ = 0xa8000000000000;
  local_318.message_.ptr_._0_2_ = 0xc004;
  local_2e0 = 0;
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  local_2d8 = 500;
  format_str_07.size_ = 6;
  format_str_07.data_ = "{0:05}";
  args_07.field_1.values_ =
       (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        *)&local_318;
  args_07.types_ =
       fmt::v5::
       format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,long_double>
       ::TYPES;
  local_2e8 = local_2d0;
  fmt::v5::
  vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
            ((range)&local_2f0,format_str_07,args_07,(locale_ref)0x0);
  local_348._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_348,local_2e8,local_2e8 + local_2e0);
  local_2f0.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&PTR_grow_002a3c18
  ;
  if (local_2e8 != local_2d0) {
    operator_delete(local_2e8);
  }
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&local_328,"\"-0042\"","format(\"{0:05}\", -42.0l)",(char (*) [6])"-0042",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348);
  if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
    operator_delete((void *)local_348._0_8_);
  }
  if (local_328._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f0);
    if (local_320._M_p == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_320._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x437,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
    if (((local_2f0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
       (local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_320,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if (local_318.success_ == true) {
    local_348._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_348,"missing \'}\' in format string","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_58[0] = 99;
      local_2e0 = 0;
      local_2f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2d8 = 500;
      format_str_08.size_ = 4;
      format_str_08.data_ = "{0:0";
      args_08.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_58;
      args_08.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_2e8 = local_2d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_2f0,format_str_08,args_08,(locale_ref)0x0);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,local_2e8,local_2e8 + local_2e0);
      local_2f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_2e8 != local_2d0) {
        operator_delete(local_2e8);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_318,
               (char (*) [101])
               "Expected: format(\"{0:0\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
      operator_delete((void *)local_348._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_2f0);
  if ((undefined8 *)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_348,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x439,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
  if (((local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_2f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_318.success_ == true) {
    local_348._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_348,"invalid format specifier for char","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_48[0] = 99;
      local_2e0 = 0;
      local_2f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2d8 = 500;
      format_str_09.size_ = 6;
      format_str_09.data_ = "{0:05}";
      args_09.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)local_48;
      args_09.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char>
           ::TYPES;
      local_2e8 = local_2d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_2f0,format_str_09,args_09,(locale_ref)0x0);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,local_2e8,local_2e8 + local_2e0);
      local_2f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_2e8 != local_2d0) {
        operator_delete(local_2e8);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_318,
               (char (*) [103])
               "Expected: format(\"{0:05}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
      operator_delete((void *)local_348._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_2f0);
  if ((undefined8 *)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_348,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x43b,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
  if (((local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_2f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_318.success_ == true) {
    local_348._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_348,"format specifier requires numeric argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_328 = "abc";
      local_2e0 = 0;
      local_2f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2d8 = 500;
      format_str_10.size_ = 6;
      format_str_10.data_ = "{0:05}";
      args_10.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_328;
      args_10.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,char[4]>
           ::TYPES;
      local_2e8 = local_2d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_2f0,format_str_10,args_10,(locale_ref)0x0);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,local_2e8,local_2e8 + local_2e0);
      local_2f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_2e8 != local_2d0) {
        operator_delete(local_2e8);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_318,
               (char (*) [105])
               "Expected: format(\"{0:05}\", \"abc\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
      operator_delete((void *)local_348._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_2f0);
  if ((undefined8 *)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_) ==
      (undefined8 *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = *(char **)CONCAT62(local_318.message_.ptr_._2_6_,local_318.message_.ptr_._0_2_);
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_348,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x43d,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
  if (((local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_2f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_300.success_ == true) {
    local_348._0_8_ = pAVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_348,"format specifier requires numeric argument","");
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      local_318.success_ = true;
      local_318._1_7_ = 0;
      local_2e0 = 0;
      local_2f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      local_2d8 = 500;
      format_str_11.size_ = 6;
      format_str_11.data_ = "{0:05}";
      args_11.field_1.values_ =
           (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
            *)&local_318;
      args_11.types_ =
           fmt::v5::
           format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>,void*>
           ::TYPES;
      local_2e8 = local_2d0;
      fmt::v5::
      vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                ((range)&local_2f0,format_str_11,args_11,(locale_ref)0x0);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,local_2e8,local_2e8 + local_2e0);
      local_2f0.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &PTR_grow_002a3c18;
      if (local_2e8 != local_2d0) {
        operator_delete(local_2e8);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0]);
      }
    }
    testing::AssertionResult::operator<<
              (&local_300,
               (char (*) [129])
               "Expected: format(\"{0:05}\", reinterpret_cast<void*>(0x42)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    if ((AssertHelperData *)local_348._0_8_ != pAVar1) {
      operator_delete((void *)local_348._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_2f0);
  if (local_300.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_300.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_348,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x43f,pcVar3);
  testing::internal::AssertHelper::operator=((AssertHelper *)local_348,(Message *)&local_2f0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_348);
  if (((local_2f0.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_2f0.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(undefined **)local_2f0.ptr_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_300.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  return;
}

Assistant:

TEST(FormatterTest, ZeroFlag) {
  EXPECT_EQ("42", format("{0:0}", 42));
  EXPECT_EQ("-0042", format("{0:05}", -42));
  EXPECT_EQ("00042", format("{0:05}", 42u));
  EXPECT_EQ("-0042", format("{0:05}", -42l));
  EXPECT_EQ("00042", format("{0:05}", 42ul));
  EXPECT_EQ("-0042", format("{0:05}", -42ll));
  EXPECT_EQ("00042", format("{0:05}", 42ull));
  EXPECT_EQ("-0042", format("{0:05}", -42.0));
  EXPECT_EQ("-0042", format("{0:05}", -42.0l));
  EXPECT_THROW_MSG(format("{0:0", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:05}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:05}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:05}", reinterpret_cast<void*>(0x42)),
      format_error, "format specifier requires numeric argument");
}